

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O1

void __thiscall Cmd::editMoveNextWord(Cmd *this,State *state)

{
  size_type sVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  pointer pcVar5;
  size_type sVar6;
  ulong uVar7;
  string sStack_98;
  char acStack_78 [72];
  
  uVar7 = (state->buf)._M_string_length;
  if (state->pos < uVar7) {
    pcVar5 = (state->buf)._M_dataplus._M_p;
    uVar3 = state->pos;
    do {
      uVar4 = uVar3 + 1;
      if (pcVar5[uVar3] != ' ') break;
      state->pos = uVar4;
      uVar3 = uVar4;
    } while (uVar4 != uVar7);
  }
  if (state->pos < uVar7) {
    pcVar5 = (state->buf)._M_dataplus._M_p;
    uVar3 = state->pos;
    while (uVar4 = uVar3 + 1, pcVar5[uVar3] != ' ') {
      state->pos = uVar4;
      uVar3 = uVar4;
      if (uVar4 == uVar7) {
        refreshLine(this,state);
        return;
      }
    }
  }
  if (this->multiline_mode == true) {
    refreshMultiLine(this,state);
    return;
  }
  sVar1 = (this->prompt)._M_string_length;
  pcVar5 = (state->buf)._M_dataplus._M_p;
  sVar6 = (state->buf)._M_string_length;
  sVar2 = state->pos;
  sStack_98._M_dataplus._M_p = (pointer)&sStack_98.field_2;
  sStack_98._M_string_length = 0;
  sStack_98.field_2._M_local_buf[0] = '\0';
  uVar3 = state->cols;
  uVar7 = sVar2 + sVar1;
  if (uVar3 <= uVar7) {
    uVar4 = (sVar2 + sVar1) - 1;
    uVar7 = uVar3 - 1;
    if (uVar4 < uVar3 - 1) {
      uVar7 = uVar4;
    }
    sVar6 = (sVar6 + uVar7) - (sVar2 + sVar1);
    pcVar5 = pcVar5 + ((sVar2 + sVar1) - uVar7);
  }
  uVar4 = sVar6 + sVar1;
  if (uVar3 < sVar6 + sVar1) {
    uVar4 = uVar3;
  }
  std::__cxx11::string::append((char *)&sStack_98);
  std::__cxx11::string::_M_append((char *)&sStack_98,(ulong)(this->prompt)._M_dataplus._M_p);
  if (state->mask_mode == true) {
    std::__cxx11::string::_M_replace_aux
              ((ulong)&sStack_98,sStack_98._M_string_length,0,(char)uVar4 - (char)sVar1);
  }
  else {
    std::__cxx11::string::append((char *)&sStack_98,(ulong)pcVar5);
  }
  refreshShowHints(this,&sStack_98,state,(int)sVar1);
  std::__cxx11::string::append((char *)&sStack_98);
  snprintf(acStack_78,0x40,"\r\x1b[%dC",uVar7 & 0xffffffff);
  std::__cxx11::string::append((char *)&sStack_98);
  write(this->out_fd_,sStack_98._M_dataplus._M_p,sStack_98._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sStack_98._M_dataplus._M_p != &sStack_98.field_2) {
    operator_delete(sStack_98._M_dataplus._M_p,
                    CONCAT71(sStack_98.field_2._M_allocated_capacity._1_7_,
                             sStack_98.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void editMoveNextWord(State *state) {
		while (state->pos < state->buf.size() && state->buf[state->pos] == ' ')
			state->pos++;

		while (state->pos < state->buf.size() && state->buf[state->pos] != ' ')
			state->pos++;

		refreshLine(state);
	}